

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O3

char * sockaddr_get_addrstr(sockaddr *sa,char *addrstr,int addrstrlen)

{
  ushort uVar1;
  long lVar2;
  char *pcVar3;
  
  *addrstr = '\0';
  uVar1 = sa->sa_family;
  if (uVar1 == 10) {
    lVar2 = 8;
  }
  else {
    if (uVar1 != 2) {
      return (char *)0x0;
    }
    lVar2 = 4;
  }
  pcVar3 = inet_ntop((uint)uVar1,sa->sa_data + lVar2 + -2,addrstr,addrstrlen);
  return pcVar3;
}

Assistant:

const char* sockaddr_get_addrstr(const struct sockaddr *sa, char *addrstr,
    int addrstrlen)
{
    const void *addr;
    addrstr[0] = '\0';
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        addr = (const void *)&sa6->sin6_addr.s6_addr;
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        addr = (const void *)&sa4->sin_addr.s_addr;
    }
    else return NULL;
    return INET_NTOP(sa->sa_family, addr, addrstr, addrstrlen);
}